

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O3

int __thiscall Indexing::ClauseCodeTree::remove(ClauseCodeTree *this,char *__filename)

{
  Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
  **ppRVar1;
  undefined8 *puVar2;
  CodeOp ***pppCVar3;
  CodeBlock *pCVar4;
  LitInfo *pLVar5;
  Self SVar6;
  Self SVar7;
  bool bVar8;
  int extraout_EAX;
  CodeOp **ppCVar9;
  ulong uVar10;
  Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
  *pRVar11;
  long lVar12;
  CodeOp *pCVar13;
  uint uVar14;
  int iVar15;
  _Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false> this_00;
  uint uVar16;
  Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  firstsInBlocks;
  Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
  rrlm;
  Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  rlms;
  Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
  res;
  Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_88;
  LitInfo local_78;
  Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_60;
  Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
  local_50;
  Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
  local_40;
  
  if (remove(Kernel::Clause*)::lInfos == '\0') {
    remove((char *)this);
  }
  Lib::
  Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(&local_88);
  Lib::
  Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_60);
  uVar10 = *(ulong *)(__filename + 0x38);
  uVar16 = (uint)uVar10;
  Lib::DArray<Indexing::CodeTree::LitInfo>::ensure(&remove::lInfos,(ulong)(uVar16 & 0xfffff));
  SVar6._M_t.
  super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
  .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>._M_head_impl =
       local_88._self._M_t.
       super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
       .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>._M_head_impl;
  if ((uVar10 & 0xfffff) == 0) {
    pCVar4 = (this->super_CodeTree)._entryPoint;
    ppCVar9 = *(CodeOp ***)
               ((long)local_88._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>.
                      _M_head_impl + 0x10);
    if (ppCVar9 ==
        *(CodeOp ***)
         ((long)local_88._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>.
                _M_head_impl + 0x18)) {
      Lib::Stack<Indexing::CodeTree::CodeOp_*>::expand
                ((Stack<Indexing::CodeTree::CodeOp_*> *)
                 local_88._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>.
                 _M_head_impl);
      ppCVar9 = *(CodeOp ***)
                 ((long)SVar6._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>.
                        _M_head_impl + 0x10);
    }
    pCVar13 = (CodeOp *)(pCVar4 + 8);
    *ppCVar9 = pCVar13;
    pppCVar3 = (CodeOp ***)
               ((long)SVar6._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>.
                      _M_head_impl + 0x10);
    *pppCVar3 = *pppCVar3 + 1;
    removeOneOfAlternatives
              (this,pCVar13,(Clause *)__filename,
               (Stack<Indexing::CodeTree::CodeOp_*> *)
               local_88._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
               .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>.
               _M_head_impl);
LAB_002b6b1c:
    Lib::
    Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_60);
    Lib::
    Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_88);
    return extraout_EAX;
  }
  uVar14 = 0;
  lVar12 = 0;
  do {
    CodeTree::LitInfo::LitInfo(&local_78,(Clause *)__filename,uVar14);
    pLVar5 = remove::lInfos._array;
    (&(remove::lInfos._array)->opposite)[lVar12] = local_78.opposite;
    puVar2 = (undefined8 *)((long)&pLVar5->liIndex + lVar12);
    *puVar2 = local_78._0_8_;
    puVar2[1] = local_78.ft;
    *(uint *)((long)&(remove::lInfos._array)->liIndex + lVar12) = uVar14;
    lVar12 = lVar12 + 0x18;
    uVar14 = uVar14 + 1;
  } while ((ulong)((uVar16 & 0xfffff) << 3) * 3 != lVar12);
  CodeTree::incTimeStamp(&this->super_CodeTree);
  SVar6._M_t.
  super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
  .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>._M_head_impl =
       local_88._self._M_t.
       super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
       .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>._M_head_impl;
  pCVar4 = (this->super_CodeTree)._entryPoint;
  ppCVar9 = *(CodeOp ***)
             ((long)local_88._self._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>.
                    _M_head_impl + 0x10);
  if (ppCVar9 ==
      *(CodeOp ***)
       ((long)local_88._self._M_t.
              super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
              .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>._M_head_impl
       + 0x18)) {
    Lib::Stack<Indexing::CodeTree::CodeOp_*>::expand
              ((Stack<Indexing::CodeTree::CodeOp_*> *)
               local_88._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
               .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>.
               _M_head_impl);
    ppCVar9 = *(CodeOp ***)
               ((long)SVar6._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>.
                      _M_head_impl + 0x10);
  }
  pCVar13 = (CodeOp *)(pCVar4 + 8);
  *ppCVar9 = pCVar13;
  pppCVar3 = (CodeOp ***)
             ((long)SVar6._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>.
                    _M_head_impl + 0x10);
  *pppCVar3 = *pppCVar3 + 1;
  iVar15 = 0;
  do {
    Lib::
    Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
    ::Recycled((Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                *)&local_78);
    this_00._M_head_impl = (RemovingLiteralMatcher *)local_78._0_8_;
    CodeTree::RemovingMatcher<false>::init
              ((RemovingMatcher<false> *)local_78._0_8_,(EVP_PKEY_CTX *)pCVar13);
    CodeTree::RemovingMatcher<false>::prepareLiteral
              (&(this_00._M_head_impl)->super_RemovingMatcher<false>);
    SVar7._M_t.
    super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
    .
    super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>,_true,_true>
          )(__uniq_ptr_data<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>,_true,_true>
            )local_60._self;
    local_50._self._M_t.
    super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
    ._M_t.
    super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
    .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>._M_head_impl =
         (__uniq_ptr_data<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>,_true,_true>
          )(__uniq_ptr_data<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>,_true,_true>
            )local_78._0_8_;
    local_78._0_8_ = (RemovingMatcher<false> *)0x0;
    pRVar11 = *(Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                **)((long)local_60._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                          .
                          super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
                          ._M_head_impl + 0x10);
    if (pRVar11 ==
        *(Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
          **)((long)local_60._self._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                    .
                    super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
                    ._M_head_impl + 0x18)) {
      Lib::
      Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
      ::expand((Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                *)local_60._self._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                  .
                  super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
                  ._M_head_impl);
      pRVar11 = *(Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                  **)((long)SVar7._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                            .
                            super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
                            ._M_head_impl + 0x10);
    }
    (pRVar11->_self)._M_t.
    super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
    ._M_t.
    super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
    .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>._M_head_impl =
         (RemovingLiteralMatcher *)
         local_50._self._M_t.
         super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
         ._M_t.
         super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
         .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>.
         _M_head_impl;
    local_50._self._M_t.
    super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
    ._M_t.
    super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
    .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>._M_head_impl =
         (__uniq_ptr_data<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>,_true,_true>
          )(__uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
            )0x0;
    ppRVar1 = (Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
               **)((long)SVar7._M_t.
                         super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                         .
                         super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
                         ._M_head_impl + 0x10);
    *ppRVar1 = *ppRVar1 + 1;
    Lib::
    Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_50);
    Lib::
    Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
    ::~Recycled((Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                 *)&local_78);
    while( true ) {
      do {
        while (bVar8 = CodeTree::RemovingMatcher<false>::next
                                 (&(this_00._M_head_impl)->super_RemovingMatcher<false>), !bVar8) {
          pRVar11 = *(Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                      **)((long)local_60._self._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                                .
                                super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
                                ._M_head_impl + 0x10);
          *(Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
            **)((long)local_60._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                      .
                      super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
                      ._M_head_impl + 0x10) = pRVar11 + -1;
          local_40._self._M_t.
          super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
          ._M_t.
          super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
          .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>.
          _M_head_impl = (__uniq_ptr_data<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>,_true,_true>
                          )pRVar11[-1]._self._M_t.
                           super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
                           .
                           super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>
                           ._M_head_impl;
          pRVar11[-1]._self._M_t.
          super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
          ._M_t.
          super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
          .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>.
          _M_head_impl = (RemovingLiteralMatcher *)0x0;
          Lib::
          Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
          ::~Recycled(*(Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                        **)((long)local_60._self._M_t.
                                  super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                                  .
                                  super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
                                  ._M_head_impl + 0x10));
          Lib::
          Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
          ::~Recycled(&local_40);
          iVar15 = iVar15 + -1;
          this_00._M_head_impl =
               (*(Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                  **)((long)local_60._self._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                            .
                            super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
                            ._M_head_impl + 0x10))[-1]._self._M_t.
               super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
               ._M_t.
               super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
               .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>.
               _M_head_impl;
        }
        pCVar13 = ((this_00._M_head_impl)->super_RemovingMatcher<false>).super_BaseMatcher.op;
        uVar10 = pCVar13->_content >> 3;
        uVar14 = (this->super_CodeTree)._curTimeStamp;
      } while (*(uint *)(uVar10 + 0x30) == uVar14);
      pCVar13 = pCVar13 + 1;
      *(uint *)(uVar10 + 0x30) = uVar14;
      if (iVar15 != (uVar16 & 0xfffff) - 1) break;
      bVar8 = removeOneOfAlternatives
                        (this,pCVar13,(Clause *)__filename,
                         (Stack<Indexing::CodeTree::CodeOp_*> *)
                         local_88._self._M_t.
                         super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                         .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>.
                         _M_head_impl);
      if (bVar8) {
        uVar10 = (ulong)(uVar16 & 0xfffff);
        lVar12 = 0;
        do {
          CodeTree::LitInfo::dispose((LitInfo *)((long)&(remove::lInfos._array)->liIndex + lVar12));
          lVar12 = lVar12 + 0x18;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
        goto LAB_002b6b1c;
      }
    }
    iVar15 = iVar15 + 1;
  } while( true );
}

Assistant:

void ClauseCodeTree::remove(Clause* cl)
{
  static DArray<LitInfo> lInfos;
  Recycled<Stack<CodeOp*>> firstsInBlocks;
  Recycled<Stack<Recycled<RemovingLiteralMatcher, NoReset>>> rlms;

  unsigned clen=cl->length();
  lInfos.ensure(clen);

  if(!clen) {
    CodeOp* op=getEntryPoint();
    firstsInBlocks->push(op);
    if(!removeOneOfAlternatives(op, cl, &*firstsInBlocks)) {
      ASSERTION_VIOLATION;
      INVALID_OPERATION("empty clause to be removed was not found");
    }
    return;
  }

  for(unsigned i=0;i<clen;i++) {
    lInfos[i]=LitInfo(cl,i);
    lInfos[i].liIndex=i;
  }
  incTimeStamp();

  CodeOp* op=getEntryPoint();
  firstsInBlocks->push(op);
  unsigned depth=0;
  for(;;) {
    RemovingLiteralMatcher* rlm = 0;
    {
      Recycled<RemovingLiteralMatcher, NoReset> rrlm; // take rlm out of recycling
      rlm = &*rrlm; // get the actual content (also to use after this initialization block)
      rlm->init(op, lInfos.array(), lInfos.size(), this, &*firstsInBlocks); // init it
      rlms->push(std::move(rrlm)); // store it in rlms (along with the obligation to return to recycling when no longer used)
    }

  iteration_restart:
    if(!rlm->next()) {
      if(depth==0) {
        ASSERTION_VIOLATION;
        INVALID_OPERATION("clause to be removed was not found");
      }
      rlms->pop();
      depth--;
      rlm = &*rlms->top();
      goto iteration_restart;
    }

    op=rlm->op;
    ASS(op->isLitEnd());
    ASS_EQ(op->getILS()->depth, depth);

    if(op->getILS()->timestamp==_curTimeStamp) {
      //we have already been here
      goto iteration_restart;
    }
    op->getILS()->timestamp=_curTimeStamp;

    op++;
    if(depth==clen-1) {
      if(removeOneOfAlternatives(op, cl, &*firstsInBlocks)) {
        //successfully removed
        break;
      }
      goto iteration_restart;
    }
    ASS_L(depth,clen-1);
    depth++;
  }

  for(unsigned i=0;i<clen;i++) {
    lInfos[i].dispose();
  }
}